

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketImpl::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketImpl *this,ExtensionsContext ctx)

{
  bool bVar1;
  CompressionParameters *pCVar2;
  CompressionParameters *local_138;
  String local_100;
  ArrayPtr<kj::CompressionParameters> local_e8;
  String local_d8;
  CompressionParameters *local_c0;
  undefined1 local_b8 [8];
  CompressionParameters arr [1];
  CompressionParameters *c_1;
  CompressionParameters *_c3034;
  String local_70;
  String local_48;
  CompressionParameters *local_30;
  CompressionParameters *c;
  CompressionParameters *_c3013;
  WebSocketImpl *pWStack_18;
  ExtensionsContext ctx_local;
  WebSocketImpl *this_local;
  
  _c3013._4_4_ = ctx;
  pWStack_18 = this;
  this_local = (WebSocketImpl *)__return_storage_ptr__;
  bVar1 = Maybe<kj::EntropySource_&>::operator==(&this->maskKeyGenerator);
  if (bVar1) {
    if (_c3013._4_4_ == REQUEST) {
      local_30 = kj::_::readMaybe<kj::CompressionParameters>(&this->compressionConfig);
      c = local_30;
      if (local_30 == (CompressionParameters *)0x0) {
        String::String(&local_70,(void *)0x0);
        Maybe<kj::String>::Maybe(__return_storage_ptr__,&local_70);
        String::~String(&local_70);
      }
      else {
        kj::_::generateExtensionResponse(&local_48,local_30);
        Maybe<kj::String>::Maybe(__return_storage_ptr__,&local_48);
        String::~String(&local_48);
      }
    }
    else {
      Maybe<kj::String>::Maybe(__return_storage_ptr__);
    }
  }
  else if (_c3013._4_4_ == RESPONSE) {
    pCVar2 = kj::_::readMaybe<kj::CompressionParameters>(&this->compressionConfig);
    if (pCVar2 == (CompressionParameters *)0x0) {
      String::String(&local_100,(void *)0x0);
      Maybe<kj::String>::Maybe(__return_storage_ptr__,&local_100);
      String::~String(&local_100);
    }
    else {
      local_c0 = (CompressionParameters *)local_b8;
      CompressionParameters::CompressionParameters(local_c0,pCVar2);
      ArrayPtr<kj::CompressionParameters>::ArrayPtr<1ul>
                (&local_e8,(CompressionParameters (*) [1])local_b8);
      kj::_::generateExtensionRequest(&local_d8,&local_e8);
      Maybe<kj::String>::Maybe(__return_storage_ptr__,&local_d8);
      String::~String(&local_d8);
      local_138 = (CompressionParameters *)&arr[0].inboundMaxWindowBits.ptr.field_1;
      do {
        local_138 = local_138 + -1;
        CompressionParameters::~CompressionParameters(local_138);
      } while (local_138 != (CompressionParameters *)local_b8);
    }
  }
  else {
    Maybe<kj::String>::Maybe(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    if (maskKeyGenerator == kj::none) {
      // `this` is the server side of a websocket.
      if (ctx == ExtensionsContext::REQUEST) {
        // The other WebSocket is (going to be) the client side of a WebSocket, i.e. this is a
        // proxying pass-through scenario. Optimization is possible. Confusingly, we have to use
        // generateExtensionResponse() (even though we're generating headers to be passed in a
        // request) because this is the function that correctly maps our config's inbound/outbound
        // to client/server.
        KJ_IF_SOME(c, compressionConfig) {
          return _::generateExtensionResponse(c);
        } else {
          return kj::String(nullptr);  // recommend no compression
        }
      } else {
        // We're apparently arranging to pump from the server side of one WebSocket to the server
        // side of another; i.e., we are a server, we have two clients, and we're trying to pump
        // between them. We cannot optimize this case, because the masking requirements are
        // different for client->server vs. server->client messages. Since we have to parse out
        // the messages anyway there's no point in trying to match extensions, so return null.
        return kj::none;
      }
    }